

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O2

ssize_t Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<37U,_Fixpp::Type::String>_>_>::write
                  (int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  undefined4 in_register_0000003c;
  string local_30 [8];
  Type value;
  
  std::__cxx11::string::string
            (local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf);
  poVar1 = std::ostream::_M_insert<unsigned_long>(CONCAT44(in_register_0000003c,__fd));
  poVar1 = std::operator<<(poVar1,"=");
  poVar1 = std::operator<<(poVar1,local_30);
  std::operator<<(poVar1,'|');
  std::__cxx11::string::~string(local_30);
  return CONCAT44(in_register_0000003c,__fd);
}

Assistant:

static std::ostream& write(std::ostream& os, const Field& field)
        {
            auto value = field.get();
            os << Field::Tag::Id << "=" << value << SOH;
            return os;
        }